

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stage2Runner.hpp
# Opt level: O0

int __thiscall Centaurus::Stage2Runner::parse_subtree(Stage2Runner *this,uint64_t *ast,int position)

{
  ReductionListener p_Var1;
  bool bVar2;
  int iVar3;
  SimpleException *this_00;
  uint64_t uVar4;
  uint64_t end;
  unsigned_long *puVar5;
  size_type sVar6;
  int local_c4;
  undefined1 local_c0 [4];
  int k_1;
  SymbolEntry sym;
  long tag;
  int l;
  uint64_t subtree_sv [2];
  int k;
  CSTMarker marker;
  allocator local_59;
  string local_58;
  int local_38;
  int local_34;
  int j;
  int i;
  CSTMarker start_marker;
  int position_local;
  uint64_t *ast_local;
  Stage2Runner *this_local;
  
  start_marker.m_value._4_4_ = position;
  CSTMarker::CSTMarker((CSTMarker *)&j,ast[position]);
  local_38 = start_marker.m_value._4_4_ + 1;
  iVar3 = start_marker.m_value._4_4_;
  while( true ) {
    local_34 = iVar3 + 1;
    if ((this->super_BaseRunner).m_bank_size >> 3 <= (ulong)(long)local_34) {
      return local_34;
    }
    if (ast[local_34] == 0) break;
    CSTMarker::CSTMarker((CSTMarker *)&stack0xffffffffffffff88,ast[local_34]);
    bVar2 = CSTMarker::is_start_marker((CSTMarker *)&stack0xffffffffffffff88);
    if (bVar2) {
      iVar3 = parse_subtree(this,ast,local_34);
      if ((ulong)(long)iVar3 < (this->super_BaseRunner).m_bank_size >> 3) {
        uVar4 = ast[local_34];
        ast[local_34] = 0;
        ast[local_38] = uVar4;
        uVar4 = ast[local_34 + 1];
        ast[local_34 + 1] = 0;
        ast[local_38 + 1] = uVar4;
        local_38 = local_38 + 2;
      }
    }
    else {
      bVar2 = CSTMarker::is_end_marker((CSTMarker *)&stack0xffffffffffffff88);
      iVar3 = local_34;
      if (bVar2) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear(&this->val_stack);
        for (tag._4_4_ = start_marker.m_value._4_4_ + 1; tag._4_4_ < local_38;
            tag._4_4_ = tag._4_4_ + 2) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->val_stack,
                     ast + (tag._4_4_ + 1));
        }
        sym.end = 0;
        iVar3 = CSTMarker::get_machine_id((CSTMarker *)&stack0xffffffffffffff88);
        uVar4 = CSTMarker::get_offset((CSTMarker *)&j);
        end = CSTMarker::get_offset((CSTMarker *)&stack0xffffffffffffff88);
        SymbolEntry::SymbolEntry((SymbolEntry *)local_c0,iVar3,uVar4,end);
        if (this->m_listener != (ReductionListener)0x0) {
          p_Var1 = this->m_listener;
          puVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                             (&this->val_stack);
          sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->val_stack)
          ;
          sym.end = (*p_Var1)((SymbolEntry *)local_c0,puVar5,(int)sVar6,this->m_listener_context);
        }
        local_c4 = start_marker.m_value._4_4_;
        if (this->reduction_counter != (atomic<int> *)0x0) {
          std::__atomic_base<int>::operator++((__atomic_base<int> *)this->reduction_counter,0);
          local_c4 = start_marker.m_value._4_4_;
        }
        while (local_c4 = local_c4 + 1, local_c4 < local_38) {
          ast[local_c4] = 0;
        }
        ast[local_34] = 0;
        uVar4 = CSTMarker::get_offset((CSTMarker *)&stack0xffffffffffffff88);
        ast[start_marker.m_value._4_4_] = uVar4 | 0x8000000000000000;
        ast[start_marker.m_value._4_4_ + 1] = sym.end;
        return local_34;
      }
    }
  }
  marker.m_value._3_1_ = 1;
  this_00 = (SimpleException *)__cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"Null entry in CST window.",&local_59);
  SimpleException::SimpleException(this_00,&local_58);
  marker.m_value._3_1_ = 0;
  __cxa_throw(this_00,&SimpleException::typeinfo,SimpleException::~SimpleException);
}

Assistant:

int parse_subtree(uint64_t *ast, int position)
  {
    CSTMarker start_marker(ast[position]);
    int i, j;
    j = position + 1;
    for (i = position + 1; i < m_bank_size / 8; i++) {
      if (ast[i] == 0) {
        throw SimpleException("Null entry in CST window.");
      }
      CSTMarker marker(ast[i]);
      if (marker.is_start_marker()) {
        int k = parse_subtree(ast, i);
        if (k < m_bank_size / 8) {
          uint64_t subtree_sv[2];
          subtree_sv[0] = ast[i];
          ast[i] = 0;
          ast[j] = subtree_sv[0];
          subtree_sv[1] = ast[i + 1];
          ast[i + 1] = 0;
          ast[j + 1] = subtree_sv[1];
          j += 2;
        }
        i = k;
      } else if (marker.is_end_marker()) {
        val_stack.clear();
        for (int l = position + 1; l < j; l += 2) {
          val_stack.emplace_back(ast[l + 1]);
        }
        long tag = 0;
        SymbolEntry sym(marker.get_machine_id(), start_marker.get_offset(), marker.get_offset());
        if (m_listener != nullptr)
          tag = m_listener(&sym, val_stack.data(), val_stack.size(), m_listener_context);
        if (reduction_counter != nullptr) {
          (*reduction_counter)++;
        }
        //Zero-fill the SV list
        for (int k = position + 1; k < j; k++) {
          ast[k] = 0;
        }
        //Zero-fill the end marker
        ast[i] = 0;
        ast[position] = ((uint64_t)1 << 63) | marker.get_offset();
        ast[position + 1] = tag;
        return i;
      }
    }
    return i;
  }